

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void BlockNotifyGenesisWait(CBlockIndex *pBlockIndex)

{
  long in_RDI;
  long in_FS_OFFSET;
  char *unaff_retaddr;
  UniqueLock<GlobalMutex> criticalblock25;
  GlobalMutex *in_stack_ffffffffffffffd8;
  long lVar1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI != 0) {
    MaybeCheckNotHeld<GlobalMutex>(in_stack_ffffffffffffffd8);
    UniqueLock<GlobalMutex>::UniqueLock
              ((UniqueLock<GlobalMutex> *)criticalblock25.super_unique_lock._8_8_,
               (GlobalMutex *)criticalblock25.super_unique_lock._M_device,(char *)pBlockIndex,
               unaff_retaddr,(int)((ulong)lVar1 >> 0x20),SUB81((ulong)lVar1 >> 0x18,0));
    fHaveGenesis = true;
    UniqueLock<GlobalMutex>::~UniqueLock((UniqueLock<GlobalMutex> *)in_stack_ffffffffffffffd8);
    std::condition_variable::notify_all();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void BlockNotifyGenesisWait(const CBlockIndex* pBlockIndex)
{
    if (pBlockIndex != nullptr) {
        {
            LOCK(g_genesis_wait_mutex);
            fHaveGenesis = true;
        }
        g_genesis_wait_cv.notify_all();
    }
}